

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O0

GeometryShaderInputType sglr::rr_util::mapGLGeometryShaderInputType(deUint32 primitive)

{
  GeometryShaderInputType local_c;
  deUint32 primitive_local;
  
  switch(primitive) {
  case 0:
    local_c = GEOMETRYSHADERINPUTTYPE_POINTS;
    break;
  case 1:
    local_c = GEOMETRYSHADERINPUTTYPE_LINES;
    break;
  case 2:
    local_c = GEOMETRYSHADERINPUTTYPE_LINES;
    break;
  case 3:
    local_c = GEOMETRYSHADERINPUTTYPE_LINES;
    break;
  case 4:
    local_c = GEOMETRYSHADERINPUTTYPE_TRIANGLES;
    break;
  case 5:
    local_c = GEOMETRYSHADERINPUTTYPE_TRIANGLES;
    break;
  case 6:
    local_c = GEOMETRYSHADERINPUTTYPE_TRIANGLES;
    break;
  default:
    local_c = GEOMETRYSHADERINPUTTYPE_LAST;
    break;
  case 10:
    local_c = GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY;
    break;
  case 0xb:
    local_c = GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY;
    break;
  case 0xc:
    local_c = GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY;
    break;
  case 0xd:
    local_c = GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY;
  }
  return local_c;
}

Assistant:

rr::GeometryShaderInputType mapGLGeometryShaderInputType (deUint32 primitive)
{
	switch (primitive)
	{
		case GL_POINTS:						return rr::GEOMETRYSHADERINPUTTYPE_POINTS;
		case GL_LINES:						return rr::GEOMETRYSHADERINPUTTYPE_LINES;
		case GL_LINE_STRIP:					return rr::GEOMETRYSHADERINPUTTYPE_LINES;
		case GL_LINE_LOOP:					return rr::GEOMETRYSHADERINPUTTYPE_LINES;
		case GL_TRIANGLES:					return rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES;
		case GL_TRIANGLE_STRIP:				return rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES;
		case GL_TRIANGLE_FAN:				return rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES;
		case GL_LINES_ADJACENCY:			return rr::GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY;
		case GL_LINE_STRIP_ADJACENCY:		return rr::GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY;
		case GL_TRIANGLES_ADJACENCY:		return rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY;
		case GL_TRIANGLE_STRIP_ADJACENCY:	return rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY;
		default:
			DE_ASSERT(DE_FALSE);
			return rr::GEOMETRYSHADERINPUTTYPE_LAST;
	}
}